

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_DataType(void)

{
  char *local_2d8;
  char *dt_str_44;
  char *pcStack_2c8;
  DataType actDataType_44;
  char *dt_str_43;
  char *pcStack_2b8;
  DataType actDataType_43;
  char *dt_str_42;
  char *pcStack_2a8;
  DataType actDataType_42;
  char *dt_str_41;
  char *pcStack_298;
  DataType actDataType_41;
  char *dt_str_40;
  char *pcStack_288;
  DataType actDataType_40;
  char *dt_str_39;
  char *pcStack_278;
  DataType actDataType_39;
  char *dt_str_38;
  char *pcStack_268;
  DataType actDataType_38;
  char *dt_str_37;
  char *pcStack_258;
  DataType actDataType_37;
  char *dt_str_36;
  char *pcStack_248;
  DataType actDataType_36;
  char *dt_str_35;
  char *pcStack_238;
  DataType actDataType_35;
  char *dt_str_34;
  char *pcStack_228;
  DataType actDataType_34;
  char *dt_str_33;
  char *pcStack_218;
  DataType actDataType_33;
  char *dt_str_32;
  char *pcStack_208;
  DataType actDataType_32;
  char *dt_str_31;
  char *pcStack_1f8;
  DataType actDataType_31;
  char *dt_str_30;
  char *pcStack_1e8;
  DataType actDataType_30;
  char *dt_str_29;
  char *pcStack_1d8;
  DataType actDataType_29;
  char *dt_str_28;
  char *pcStack_1c8;
  DataType actDataType_28;
  char *dt_str_27;
  char *pcStack_1b8;
  DataType actDataType_27;
  char *dt_str_26;
  char *pcStack_1a8;
  DataType actDataType_26;
  char *dt_str_25;
  char *pcStack_198;
  DataType actDataType_25;
  char *dt_str_24;
  char *pcStack_188;
  DataType actDataType_24;
  char *dt_str_23;
  char *pcStack_178;
  DataType actDataType_23;
  char *dt_str_22;
  char *pcStack_168;
  DataType actDataType_22;
  char *dt_str_21;
  char *pcStack_158;
  DataType actDataType_21;
  char *dt_str_20;
  char *pcStack_148;
  DataType actDataType_20;
  char *dt_str_19;
  char *pcStack_138;
  DataType actDataType_19;
  char *dt_str_18;
  char *pcStack_128;
  DataType actDataType_18;
  char *dt_str_17;
  char *pcStack_118;
  DataType actDataType_17;
  char *dt_str_16;
  char *pcStack_108;
  DataType actDataType_16;
  char *dt_str_15;
  char *pcStack_f8;
  DataType actDataType_15;
  char *dt_str_14;
  char *pcStack_e8;
  DataType actDataType_14;
  char *dt_str_13;
  char *pcStack_d8;
  DataType actDataType_13;
  char *dt_str_12;
  char *pcStack_c8;
  DataType actDataType_12;
  char *dt_str_11;
  char *pcStack_b8;
  DataType actDataType_11;
  char *dt_str_10;
  char *pcStack_a8;
  DataType actDataType_10;
  char *dt_str_9;
  char *pcStack_98;
  DataType actDataType_9;
  char *dt_str_8;
  char *pcStack_88;
  DataType actDataType_8;
  char *dt_str_7;
  char *pcStack_78;
  DataType actDataType_7;
  char *dt_str_6;
  char *pcStack_68;
  DataType actDataType_6;
  char *dt_str_5;
  char *pcStack_58;
  DataType actDataType_5;
  char *dt_str_4;
  char *pcStack_48;
  DataType actDataType_4;
  char *dt_str_3;
  char *pcStack_38;
  DataType actDataType_3;
  char *dt_str_2;
  char *pcStack_28;
  DataType actDataType_2;
  char *dt_str_1;
  char *pcStack_18;
  DataType actDataType_1;
  char *dt_str;
  DataType actDataType;
  
  dt_str._4_4_ = xercesc_4_0::XSValue::getDataType
                           ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  if (dt_str._4_4_ != 0) {
    pcStack_18 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_18,
           (ulong)dt_str._4_4_,0);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffffe8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_1._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN);
  if (dt_str_1._4_4_ != 1) {
    pcStack_28 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_28,
           (ulong)dt_str_1._4_4_,1);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffffd8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_2._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
  if (dt_str_2._4_4_ != 2) {
    pcStack_38 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_38,
           (ulong)dt_str_2._4_4_,2);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffffc8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_3._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
  if (dt_str_3._4_4_ != 3) {
    pcStack_48 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_48,
           (ulong)dt_str_3._4_4_,3);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffffb8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_4._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
  if (dt_str_4._4_4_ != 4) {
    pcStack_58 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_58,
           (ulong)dt_str_4._4_4_,4);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffffa8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_5._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
  if (dt_str_5._4_4_ != 5) {
    pcStack_68 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_68,
           (ulong)dt_str_5._4_4_,5);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_6._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
  if (dt_str_6._4_4_ != 6) {
    pcStack_78 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_78,
           (ulong)dt_str_6._4_4_,6);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_7._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME);
  if (dt_str_7._4_4_ != 7) {
    pcStack_88 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_88,
           (ulong)dt_str_7._4_4_,7);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_8._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
  if (dt_str_8._4_4_ != 8) {
    pcStack_98 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_98,
           (ulong)dt_str_8._4_4_,8);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_9._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
  if (dt_str_9._4_4_ != 9) {
    pcStack_a8 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_a8,
           (ulong)dt_str_9._4_4_,9);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_10._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR);
  if (dt_str_10._4_4_ != 10) {
    pcStack_b8 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_b8,
           (ulong)dt_str_10._4_4_,10);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_11._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY);
  if (dt_str_11._4_4_ != 0xb) {
    pcStack_c8 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_c8,
           (ulong)dt_str_11._4_4_,0xb);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_12._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
  if (dt_str_12._4_4_ != 0xc) {
    pcStack_d8 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_d8,
           (ulong)dt_str_12._4_4_,0xc);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff28,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_13._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
  if (dt_str_13._4_4_ != 0xd) {
    pcStack_e8 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_e8,
           (ulong)dt_str_13._4_4_,0xd);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff18,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_14._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY);
  if (dt_str_14._4_4_ != 0xe) {
    pcStack_f8 = (char *)xercesc_4_0::XMLString::transcode
                                   ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY,
                                    xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_f8,
           (ulong)dt_str_14._4_4_,0xe);
    xercesc_4_0::XMLString::release
              (&stack0xffffffffffffff08,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_15._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
  if (dt_str_15._4_4_ != 0xf) {
    pcStack_108 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_108,
           (ulong)dt_str_15._4_4_,0xf);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffef8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_16._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  if (dt_str_16._4_4_ != 0x10) {
    pcStack_118 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_118,
           (ulong)dt_str_16._4_4_,0x10);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffee8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_17._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
  if (dt_str_17._4_4_ != 0x11) {
    pcStack_128 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_128,
           (ulong)dt_str_17._4_4_,0x11);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffed8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_18._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgNotationString);
  if (dt_str_18._4_4_ != 0x12) {
    pcStack_138 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgNotationString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_138,
           (ulong)dt_str_18._4_4_,0x12);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffec8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_19._4_4_ =
       xercesc_4_0::XSValue::getDataType
                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING);
  if (dt_str_19._4_4_ != 0x13) {
    pcStack_148 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_148,
           (ulong)dt_str_19._4_4_,0x13);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffeb8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_20._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
  if (dt_str_20._4_4_ != 0x14) {
    pcStack_158 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_158,
           (ulong)dt_str_20._4_4_,0x14);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffea8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_21._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
  if (dt_str_21._4_4_ != 0x15) {
    pcStack_168 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_168,
           (ulong)dt_str_21._4_4_,0x15);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_22._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString);
  if (dt_str_22._4_4_ != 0x16) {
    pcStack_178 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_178,
           (ulong)dt_str_22._4_4_,0x16);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_23._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString);
  if (dt_str_23._4_4_ != 0x17) {
    pcStack_188 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_188,
           (ulong)dt_str_23._4_4_,0x17);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_24._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME);
  if (dt_str_24._4_4_ != 0x18) {
    pcStack_198 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_198,
           (ulong)dt_str_24._4_4_,0x18);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_25._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME);
  if (dt_str_25._4_4_ != 0x19) {
    pcStack_1a8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_1a8,
           (ulong)dt_str_25._4_4_,0x19);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_26._4_4_ = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgIDString);
  if (dt_str_26._4_4_ != 0x1a) {
    pcStack_1b8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgIDString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_1b8,
           (ulong)dt_str_26._4_4_,0x1a);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_27._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString);
  if (dt_str_27._4_4_ != 0x1b) {
    pcStack_1c8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_1c8,
           (ulong)dt_str_27._4_4_,0x1b);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_28._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString);
  if (dt_str_28._4_4_ != 0x1c) {
    pcStack_1d8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_1d8,
           (ulong)dt_str_28._4_4_,0x1c);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe28,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_29._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString);
  if (dt_str_29._4_4_ != 0x1d) {
    pcStack_1e8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_1e8,
           (ulong)dt_str_29._4_4_,0x1d);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe18,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_30._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString);
  if (dt_str_30._4_4_ != 0x1e) {
    pcStack_1f8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_1f8,
           (ulong)dt_str_30._4_4_,0x1e);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffe08,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_31._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  if (dt_str_31._4_4_ != 0x1f) {
    pcStack_208 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_208,
           (ulong)dt_str_31._4_4_,0x1f);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffdf8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_32._4_4_ =
       xercesc_4_0::XSValue::getDataType
                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  if (dt_str_32._4_4_ != 0x20) {
    pcStack_218 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER
                                     ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_218,
           (ulong)dt_str_32._4_4_,0x20);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffde8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_33._4_4_ =
       xercesc_4_0::XSValue::getDataType
                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER);
  if (dt_str_33._4_4_ != 0x21) {
    pcStack_228 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_228,
           (ulong)dt_str_33._4_4_,0x21);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffdd8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_34._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG);
  if (dt_str_34._4_4_ != 0x22) {
    pcStack_238 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_238,
           (ulong)dt_str_34._4_4_,0x22);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffdc8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_35._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
  if (dt_str_35._4_4_ != 0x23) {
    pcStack_248 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_248,
           (ulong)dt_str_35._4_4_,0x23);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffdb8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_36._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
  if (dt_str_36._4_4_ != 0x24) {
    pcStack_258 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_258,
           (ulong)dt_str_36._4_4_,0x24);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffda8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_37._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
  if (dt_str_37._4_4_ != 0x25) {
    pcStack_268 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_268,
           (ulong)dt_str_37._4_4_,0x25);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd98,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_38._4_4_ =
       xercesc_4_0::XSValue::getDataType
                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  if (dt_str_38._4_4_ != 0x26) {
    pcStack_278 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER
                                     ,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_278,
           (ulong)dt_str_38._4_4_,0x26);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_39._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG);
  if (dt_str_39._4_4_ != 0x27) {
    pcStack_288 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_288,
           (ulong)dt_str_39._4_4_,0x27);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd78,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_40._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
  if (dt_str_40._4_4_ != 0x28) {
    pcStack_298 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_298,
           (ulong)dt_str_40._4_4_,0x28);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd68,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_41._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
  if (dt_str_41._4_4_ != 0x29) {
    pcStack_2a8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_2a8,
           (ulong)dt_str_41._4_4_,0x29);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_42._4_4_ =
       xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
  if (dt_str_42._4_4_ != 0x2a) {
    pcStack_2b8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_2b8,
           (ulong)dt_str_42._4_4_,0x2a);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_43._4_4_ =
       xercesc_4_0::XSValue::getDataType
                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
  if (dt_str_43._4_4_ != 0x2b) {
    pcStack_2c8 = (char *)xercesc_4_0::XMLString::transcode
                                    ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER,
                                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",pcStack_2c8,
           (ulong)dt_str_43._4_4_,0x2b);
    xercesc_4_0::XMLString::release
              (&stack0xfffffffffffffd38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  dt_str_44._4_4_ = xercesc_4_0::XSValue::getDataType((wchar16 *)&xercesc_4_0::XMLUni::fgLongMaxInc)
  ;
  if (dt_str_44._4_4_ != 0x2c) {
    local_2d8 = (char *)xercesc_4_0::XMLString::transcode
                                  ((wchar16 *)&xercesc_4_0::XMLUni::fgLongMaxInc,
                                   xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    printf("DATATYPE_TEST Fails: data=<%s>, actDataType=<%d>, expDataType=<%d>\n",local_2d8,
           (ulong)dt_str_44._4_4_,0x2c);
    xercesc_4_0::XMLString::release(&local_2d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    errSeen = true;
  }
  return;
}

Assistant:

void test_DataType()
{

    DATATYPE_TEST( SchemaSymbols::fgDT_STRING,             XSValue::dt_string);
    DATATYPE_TEST( SchemaSymbols::fgDT_BOOLEAN,            XSValue::dt_boolean);
    DATATYPE_TEST( SchemaSymbols::fgDT_DECIMAL,            XSValue::dt_decimal);
    DATATYPE_TEST( SchemaSymbols::fgDT_FLOAT,              XSValue::dt_float);
    DATATYPE_TEST( SchemaSymbols::fgDT_DOUBLE,             XSValue::dt_double);
    DATATYPE_TEST( SchemaSymbols::fgDT_DURATION,           XSValue::dt_duration);
    DATATYPE_TEST( SchemaSymbols::fgDT_DATETIME,           XSValue::dt_dateTime);
    DATATYPE_TEST( SchemaSymbols::fgDT_TIME,               XSValue::dt_time);
    DATATYPE_TEST( SchemaSymbols::fgDT_DATE,               XSValue::dt_date);
    DATATYPE_TEST( SchemaSymbols::fgDT_YEARMONTH,          XSValue::dt_gYearMonth);
    DATATYPE_TEST( SchemaSymbols::fgDT_YEAR,               XSValue::dt_gYear);
    DATATYPE_TEST( SchemaSymbols::fgDT_MONTHDAY,           XSValue::dt_gMonthDay);
    DATATYPE_TEST( SchemaSymbols::fgDT_DAY,                XSValue::dt_gDay);
    DATATYPE_TEST( SchemaSymbols::fgDT_MONTH,              XSValue::dt_gMonth);
    DATATYPE_TEST( SchemaSymbols::fgDT_HEXBINARY,          XSValue::dt_hexBinary);
    DATATYPE_TEST( SchemaSymbols::fgDT_BASE64BINARY,       XSValue::dt_base64Binary);
    DATATYPE_TEST( SchemaSymbols::fgDT_ANYURI,             XSValue::dt_anyURI);
    DATATYPE_TEST( SchemaSymbols::fgDT_QNAME,              XSValue::dt_QName);
    DATATYPE_TEST( XMLUni::fgNotationString,               XSValue::dt_NOTATION);
    DATATYPE_TEST( SchemaSymbols::fgDT_NORMALIZEDSTRING,   XSValue::dt_normalizedString);
    DATATYPE_TEST( SchemaSymbols::fgDT_TOKEN,              XSValue::dt_token);
    DATATYPE_TEST( SchemaSymbols::fgDT_LANGUAGE,           XSValue::dt_language);
    DATATYPE_TEST( XMLUni::fgNmTokenString,                XSValue::dt_NMTOKEN);
    DATATYPE_TEST( XMLUni::fgNmTokensString,               XSValue::dt_NMTOKENS);
    DATATYPE_TEST( SchemaSymbols::fgDT_NAME,               XSValue::dt_Name);
    DATATYPE_TEST( SchemaSymbols::fgDT_NCNAME,             XSValue::dt_NCName);
    DATATYPE_TEST( XMLUni::fgIDString,                     XSValue::dt_ID);
    DATATYPE_TEST( XMLUni::fgIDRefString,                  XSValue::dt_IDREF);
    DATATYPE_TEST( XMLUni::fgIDRefsString,                 XSValue::dt_IDREFS);
    DATATYPE_TEST( XMLUni::fgEntityString,                 XSValue::dt_ENTITY);
    DATATYPE_TEST( XMLUni::fgEntitiesString,               XSValue::dt_ENTITIES);
    DATATYPE_TEST( SchemaSymbols::fgDT_INTEGER,            XSValue::dt_integer);
    DATATYPE_TEST( SchemaSymbols::fgDT_NONPOSITIVEINTEGER, XSValue::dt_nonPositiveInteger);
    DATATYPE_TEST( SchemaSymbols::fgDT_NEGATIVEINTEGER,    XSValue::dt_negativeInteger);
    DATATYPE_TEST( SchemaSymbols::fgDT_LONG,               XSValue::dt_long);
    DATATYPE_TEST( SchemaSymbols::fgDT_INT,                XSValue::dt_int);
    DATATYPE_TEST( SchemaSymbols::fgDT_SHORT,              XSValue::dt_short);
    DATATYPE_TEST( SchemaSymbols::fgDT_BYTE,               XSValue::dt_byte);
    DATATYPE_TEST( SchemaSymbols::fgDT_NONNEGATIVEINTEGER, XSValue::dt_nonNegativeInteger);
    DATATYPE_TEST( SchemaSymbols::fgDT_ULONG,              XSValue::dt_unsignedLong);
    DATATYPE_TEST( SchemaSymbols::fgDT_UINT,               XSValue::dt_unsignedInt);
    DATATYPE_TEST( SchemaSymbols::fgDT_USHORT,             XSValue::dt_unsignedShort);
    DATATYPE_TEST( SchemaSymbols::fgDT_UBYTE,              XSValue::dt_unsignedByte);
    DATATYPE_TEST( SchemaSymbols::fgDT_POSITIVEINTEGER,    XSValue::dt_positiveInteger);

    DATATYPE_TEST( XMLUni::fgLongMaxInc,                   XSValue::dt_MAXCOUNT);
}